

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManTransformTwoWord2DualOutput(Gia_Man_t *p)

{
  int iVar1;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pObj;
  Gia_Man_t *pGVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  uVar5 = p->vCos->nSize - p->nRegs;
  iVar7 = (int)uVar5 / 2;
  if ((uVar5 & 1) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                  ,0xbce,"Gia_Man_t *Gia_ManTransformTwoWord2DualOutput(Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  for (iVar6 = 0; iVar6 < p->vCis->nSize; iVar6 = iVar6 + 1) {
    pGVar3 = Gia_ManCi(p,iVar6);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar5 = Gia_ManAppendCi(p_00);
    pGVar3->Value = uVar5;
  }
  for (iVar6 = 0; iVar6 < p->nObjs; iVar6 = iVar6 + 1) {
    pGVar3 = Gia_ManObj(p,iVar6);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar3 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar3) {
      iVar1 = Gia_ObjFanin0Copy(pGVar3);
      iLit1 = Gia_ObjFanin1Copy(pGVar3);
      uVar5 = Gia_ManHashAnd(p_00,iVar1,iLit1);
      pGVar3->Value = uVar5;
    }
  }
  for (iVar6 = 0; iVar6 < p->vCos->nSize - p->nRegs; iVar6 = iVar6 + 1) {
    pGVar3 = Gia_ManCo(p,iVar6);
    if ((iVar7 == iVar6) || (pGVar3 == (Gia_Obj_t *)0x0)) break;
    pObj = Gia_ManPo(p,iVar7 + iVar6);
    iVar1 = Gia_ObjFanin0Copy(pGVar3);
    Gia_ManAppendCo(p_00,iVar1);
    iVar1 = Gia_ObjFanin0Copy(pObj);
    Gia_ManAppendCo(p_00,iVar1);
  }
  for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
    pGVar3 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar7);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iVar6 = Gia_ObjFanin0Copy(pGVar3);
    uVar5 = Gia_ManAppendCo(p_00,iVar6);
    pGVar3->Value = uVar5;
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar4 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar4;
}

Assistant:

Gia_Man_t * Gia_ManTransformTwoWord2DualOutput( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObj2;
    int i, nPart = Gia_ManPoNum(p)/2;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
    {
        if ( i == nPart )
            break;
        pObj2 = Gia_ManPo( p, nPart + i );
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj2) );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}